

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall slang::ast::Expression::unwrapImplicitConversions(Expression *this)

{
  bool bVar1;
  ConversionExpression *this_00;
  Expression *in_RDI;
  ConversionExpression *conv;
  Expression *expr;
  Expression *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    if (local_10->kind != Conversion) {
      return local_10;
    }
    this_00 = as<slang::ast::ConversionExpression>(local_10);
    bVar1 = ConversionExpression::isImplicit(this_00);
    if (!bVar1) break;
    local_10 = ConversionExpression::operand(this_00);
  }
  return local_10;
}

Assistant:

const Expression& Expression::unwrapImplicitConversions() const {
    auto expr = this;
    while (expr->kind == ExpressionKind::Conversion) {
        auto& conv = expr->as<ConversionExpression>();
        if (!conv.isImplicit())
            break;

        expr = &conv.operand();
    }
    return *expr;
}